

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               Matrix<double,__1,__1,_0,__1,__1> *rhs)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar1;
  Index IVar2;
  Index IVar3;
  Matrix<double,__1,__1,_0,__1,__1> *in_RDX;
  Matrix<double,__1,__1,_0,__1,__1> *in_RSI;
  Scalar *in_stack_00000098;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_000000a0;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_000000a8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_000000b0;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffe0;
  
  pDVar1 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                     ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x157c6d);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x157c7c);
  this = pDVar1;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x157c96);
  if (((long)(pDVar1 + IVar3 + IVar2) < 0x14) &&
     (IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x157cb1),
     0 < IVar2)) {
    generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    return;
  }
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this);
  scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

static void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    if((rhs.rows()+dst.rows()+dst.cols())<20 && rhs.rows()>0)
      lazyproduct::evalTo(dst, lhs, rhs);
    else
    {
      dst.setZero();
      scaleAndAddTo(dst, lhs, rhs, Scalar(1));
    }
  }